

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_BorderagentGetLocator_Test::TestBody
          (InterpreterTestSuite_PC_BorderagentGetLocator_Test *this)

{
  TypedExpectation<ot::commissioner::Error_(unsigned_short_&)> *this_00;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_240;
  AssertHelper local_238;
  AssertionResult gtest_ar_;
  Expression expr;
  _Any_data local_1f8 [4];
  Value value;
  undefined1 local_168 [8];
  _Alloc_hider local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  testing::A<unsigned_short&>();
  CommissionerAppMock::gmock_GetBorderAgentLocator
            ((MockSpec<ot::commissioner::Error_(unsigned_short_&)> *)&value,
             ctx.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (Matcher<unsigned_short_&> *)&expr);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::
            InternalExpectedAt((MockSpec<ot::commissioner::Error_(unsigned_short_&)> *)&value,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                               ,0x6d3,"*ctx.mDefaultCommissionerObject","GetBorderAgentLocator(_)");
  local_168._0_4_ = kNone;
  local_160._M_p = (pointer)&local_150;
  local_158 = 0;
  local_150._M_local_buf[0] = '\0';
  testing::Return<ot::commissioner::Error>((testing *)&gtest_ar_,(Error *)local_168);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(unsigned_short_&)> *)local_1f8,
             (ReturnAction *)&gtest_ar_);
  testing::internal::TypedExpectation<ot::commissioner::Error_(unsigned_short_&)>::WillOnce
            (this_00,(Action<ot::commissioner::Error_(unsigned_short_&)> *)local_1f8);
  std::_Function_base::~_Function_base((_Function_base *)local_1f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&local_160);
  testing::internal::MatcherBase<unsigned_short_&>::~MatcherBase
            ((MatcherBase<unsigned_short_&> *)&value.mError.mMessage);
  testing::internal::MatcherBase<unsigned_short_&>::~MatcherBase
            ((MatcherBase<unsigned_short_&> *)&expr);
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  value.mError.mCode = kNone;
  value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
  value.mError.mMessage._M_string_length = 0;
  value.mError.mMessage.field_2._M_local_buf[0] = '\0';
  value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
  value.mData._M_string_length = 0;
  value.mData.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)local_1f8[0]._M_pod_data,"borderagent get locator",(allocator *)&local_240);
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&expr,&gtest_ar_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_1f8[0]._M_pod_data);
  ot::commissioner::Interpreter::Eval((Value *)local_1f8,&ctx.mInterpreter,&expr);
  ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_1f8);
  ot::commissioner::Interpreter::Value::~Value((Value *)local_1f8);
  gtest_ar_.success_ = ot::commissioner::Interpreter::Value::HasNoError(&value);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_240);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f8,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x6da,(char *)local_1f8[0]._0_8_);
    testing::internal::AssertHelper::operator=(&local_238,(Message *)&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    std::__cxx11::string::~string((string *)local_1f8[0]._M_pod_data);
    if (local_240._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_240._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  ot::commissioner::Interpreter::Value::~Value(&value);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expr);
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BorderagentGetLocator)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetBorderAgentLocator(_)).WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("borderagent get locator");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}